

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_t * matd_crossproduct(matd_t *a,matd_t *b)

{
  int iVar1;
  matd_t *pmVar2;
  matd_t *r;
  matd_t *b_local;
  matd_t *a_local;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x3a9,"matd_t *matd_crossproduct(const matd_t *, const matd_t *)");
  }
  if (b != (matd_t *)0x0) {
    iVar1 = matd_is_vector_len(a,3);
    if (iVar1 != 0) {
      iVar1 = matd_is_vector_len(b,3);
      if (iVar1 != 0) {
        pmVar2 = matd_create(a->nrows,a->ncols);
        pmVar2[1] = (matd_t)((double)a[2] * (double)b[3] + -((double)a[3] * (double)b[2]));
        pmVar2[2] = (matd_t)((double)a[3] * (double)b[1] + -((double)a[1] * (double)b[3]));
        pmVar2[3] = (matd_t)((double)a[1] * (double)b[2] + -((double)a[2] * (double)b[1]));
        return pmVar2;
      }
    }
    __assert_fail("matd_is_vector_len(a, 3) && matd_is_vector_len(b, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x3ab,"matd_t *matd_crossproduct(const matd_t *, const matd_t *)");
  }
  __assert_fail("b != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x3aa,"matd_t *matd_crossproduct(const matd_t *, const matd_t *)");
}

Assistant:

matd_t *matd_crossproduct(const matd_t *a, const matd_t *b)
{ // only defined for vecs (col or row) of length 3
    assert(a != NULL);
    assert(b != NULL);
    assert(matd_is_vector_len(a, 3) && matd_is_vector_len(b, 3));

    matd_t * r = matd_create(a->nrows, a->ncols);

    r->data[0] = a->data[1] * b->data[2] - a->data[2] * b->data[1];
    r->data[1] = a->data[2] * b->data[0] - a->data[0] * b->data[2];
    r->data[2] = a->data[0] * b->data[1] - a->data[1] * b->data[0];

    return r;
}